

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool __thiscall
cmFileCommand::HandleDownloadCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  cmMakefile *pcVar1;
  const_iterator list;
  CURL_conflict *pCVar2;
  bool bVar3;
  bool bVar4;
  __type _Var5;
  byte bVar6;
  size_type sVar7;
  reference pbVar8;
  char *pcVar9;
  pointer pbVar10;
  auto_ptr_ref<cmCryptoHash> r;
  undefined8 uVar11;
  ulong uVar12;
  ostream *poVar13;
  cmCryptoHash *pcVar14;
  reference value;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> local_10a8;
  value_type_conflict local_1099;
  string local_1098;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1078;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1058;
  undefined1 local_1038 [8];
  string status;
  ostringstream oss;
  allocator local_e99;
  string local_e98;
  undefined1 local_e78 [8];
  string actualHash_1;
  ostringstream local_e38 [8];
  ostringstream result_1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_cc0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_cb8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_cb0;
  const_iterator h;
  curl_slist *headers;
  undefined1 local_c98 [8];
  string e_15;
  undefined1 local_c70 [8];
  string e_14;
  undefined1 local_c48 [8];
  string e_13;
  undefined1 local_c20 [8];
  string e_12;
  cURLProgressHelper helper;
  undefined1 local_bc8 [8];
  string e_11;
  undefined1 local_ba0 [8];
  string e_10;
  undefined1 local_b78 [8];
  string e_9;
  undefined1 local_b50 [8];
  string e_8;
  undefined1 local_b28 [8];
  string e_7;
  cmFileCommandVectorOfChar chunkDebug;
  string *cainfo_err;
  undefined1 local_ac0 [8];
  string e_6;
  undefined1 local_a98 [8];
  string e_5;
  undefined1 local_a70 [8];
  string e_4;
  undefined1 local_a48 [8];
  string e_3;
  undefined1 local_a20 [8];
  string e_2;
  undefined1 local_9f8 [8];
  string e_1;
  undefined1 local_9d0 [8];
  string e;
  CURLcode res;
  cURLEasyGuard g_curl;
  string local_998;
  CURL_conflict *local_978;
  CURL *curl;
  string local_968;
  long local_948;
  ofstream fout;
  undefined1 local_728 [8];
  string errstring;
  string dir;
  ostringstream local_6c8 [8];
  ostringstream result;
  undefined1 local_550 [8];
  string actualHash;
  string msg;
  undefined1 local_508 [8];
  string err_2;
  string local_4e0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_4c0;
  allocator local_4b1;
  string local_4b0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_490;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_488;
  allocator local_461;
  undefined1 local_460 [8];
  string err_1;
  auto_ptr<cmCryptoHash> local_430;
  cmCryptoHash *local_428;
  string local_420;
  string local_400;
  undefined1 local_3e0 [8];
  string algo;
  undefined1 local_3b8 [8];
  string err;
  size_type pos;
  string local_388;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_368;
  string local_360;
  auto_ptr local_340 [8];
  cmCryptoHash *local_338;
  allocator local_329;
  string local_328;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_308;
  allocator local_2f9;
  string local_2f8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2d8;
  allocator local_2c9;
  string local_2c8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2a8;
  allocator local_299;
  string local_298;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_278;
  allocator local_269;
  string local_268;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_248;
  allocator local_239;
  string local_238;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_218;
  int local_210;
  allocator local_209;
  string local_208;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e0;
  undefined1 local_1d8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  curl_headers;
  string userpwd;
  bool showProgress;
  auto_ptr<cmCryptoHash> hash;
  string hashMatchMSG;
  string expectedHash;
  string local_148;
  char *local_128;
  char *cainfo;
  string local_118;
  byte local_f1;
  undefined1 local_f0 [7];
  bool tls_verify;
  string statusVar;
  string logVar;
  long inactivity_timeout;
  long timeout;
  string file;
  string url;
  allocator local_49;
  string local_48;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_28;
  const_iterator i;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmFileCommand *this_local;
  
  i._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args;
  local_28._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(args);
  sVar7 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)i._M_current);
  if (sVar7 < 3) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,"DOWNLOAD must be called with at least three arguments.",
               &local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
    goto LAB_0076f4ed;
  }
  __gnu_cxx::
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator++(&local_28);
  pbVar8 = __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&local_28);
  std::__cxx11::string::string((string *)(file.field_2._M_local_buf + 8),(string *)pbVar8);
  __gnu_cxx::
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator++(&local_28);
  pbVar8 = __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&local_28);
  std::__cxx11::string::string((string *)&timeout,(string *)pbVar8);
  __gnu_cxx::
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::operator++(&local_28);
  inactivity_timeout = 0;
  logVar.field_2._8_8_ = 0;
  std::__cxx11::string::string((string *)(statusVar.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_f0);
  pcVar1 = (this->super_cmCommand).Makefile;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_118,"CMAKE_TLS_VERIFY",(allocator *)((long)&cainfo + 7));
  bVar3 = cmMakefile::IsOn(pcVar1,&local_118);
  std::__cxx11::string::~string((string *)&local_118);
  std::allocator<char>::~allocator((allocator<char> *)((long)&cainfo + 7));
  pcVar1 = (this->super_cmCommand).Makefile;
  local_f1 = bVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_148,"CMAKE_TLS_CAINFO",
             (allocator *)(expectedHash.field_2._M_local_buf + 0xf));
  pcVar9 = cmMakefile::GetDefinition(pcVar1,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator((allocator<char> *)(expectedHash.field_2._M_local_buf + 0xf));
  local_128 = pcVar9;
  std::__cxx11::string::string((string *)(hashMatchMSG.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)&hash);
  ::cm::auto_ptr<cmCryptoHash>::auto_ptr
            ((auto_ptr<cmCryptoHash> *)&stack0xfffffffffffffe68,(cmCryptoHash *)0x0);
  bVar3 = false;
  std::__cxx11::string::string
            ((string *)
             &curl_headers.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_1d8);
  while( true ) {
    local_1e0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(i._M_current);
    bVar4 = __gnu_cxx::operator!=(&local_28,&local_1e0);
    if (!bVar4) break;
    pbVar8 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_28);
    bVar4 = std::operator==(pbVar8,"TIMEOUT");
    if (bVar4) {
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_28);
      local_1e8._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end(i._M_current);
      bVar4 = __gnu_cxx::operator!=(&local_28,&local_1e8);
      if (!bVar4) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_208,"DOWNLOAD missing time for TIMEOUT.",&local_209);
        cmCommand::SetError(&this->super_cmCommand,&local_208);
        std::__cxx11::string::~string((string *)&local_208);
        std::allocator<char>::~allocator((allocator<char> *)&local_209);
        this_local._7_1_ = 0;
        local_210 = 1;
        goto LAB_0076f417;
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator->(&local_28);
      pcVar9 = (char *)std::__cxx11::string::c_str();
      inactivity_timeout = atol(pcVar9);
    }
    else {
      pbVar8 = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_28);
      bVar4 = std::operator==(pbVar8,"INACTIVITY_TIMEOUT");
      if (bVar4) {
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&local_28);
        local_218._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(i._M_current);
        bVar4 = __gnu_cxx::operator!=(&local_28,&local_218);
        if (!bVar4) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_238,"DOWNLOAD missing time for INACTIVITY_TIMEOUT.",&local_239
                    );
          cmCommand::SetError(&this->super_cmCommand,&local_238);
          std::__cxx11::string::~string((string *)&local_238);
          std::allocator<char>::~allocator((allocator<char> *)&local_239);
          this_local._7_1_ = 0;
          local_210 = 1;
          goto LAB_0076f417;
        }
        __gnu_cxx::
        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator->(&local_28);
        pcVar9 = (char *)std::__cxx11::string::c_str();
        logVar.field_2._8_8_ = atol(pcVar9);
      }
      else {
        pbVar8 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&local_28);
        bVar4 = std::operator==(pbVar8,"LOG");
        if (bVar4) {
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_28);
          local_248._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(i._M_current);
          bVar4 = __gnu_cxx::operator==(&local_28,&local_248);
          if (bVar4) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&local_268,"DOWNLOAD missing VAR for LOG.",&local_269);
            cmCommand::SetError(&this->super_cmCommand,&local_268);
            std::__cxx11::string::~string((string *)&local_268);
            std::allocator<char>::~allocator((allocator<char> *)&local_269);
            this_local._7_1_ = 0;
            local_210 = 1;
            goto LAB_0076f417;
          }
          pbVar8 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_28);
          std::__cxx11::string::operator=
                    ((string *)(statusVar.field_2._M_local_buf + 8),(string *)pbVar8);
        }
        else {
          pbVar8 = __gnu_cxx::
                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&local_28);
          bVar4 = std::operator==(pbVar8,"STATUS");
          if (bVar4) {
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&local_28);
            local_278._M_current =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::end(i._M_current);
            bVar4 = __gnu_cxx::operator==(&local_28,&local_278);
            if (bVar4) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)&local_298,"DOWNLOAD missing VAR for STATUS.",&local_299);
              cmCommand::SetError(&this->super_cmCommand,&local_298);
              std::__cxx11::string::~string((string *)&local_298);
              std::allocator<char>::~allocator((allocator<char> *)&local_299);
              this_local._7_1_ = 0;
              local_210 = 1;
              goto LAB_0076f417;
            }
            pbVar8 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_28);
            std::__cxx11::string::operator=((string *)local_f0,(string *)pbVar8);
          }
          else {
            pbVar8 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_28);
            bVar4 = std::operator==(pbVar8,"TLS_VERIFY");
            if (bVar4) {
              __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&local_28);
              local_2a8._M_current =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end(i._M_current);
              bVar4 = __gnu_cxx::operator!=(&local_28,&local_2a8);
              if (!bVar4) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)&local_2c8,"TLS_VERIFY missing bool value.",&local_2c9);
                cmCommand::SetError(&this->super_cmCommand,&local_2c8);
                std::__cxx11::string::~string((string *)&local_2c8);
                std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
                this_local._7_1_ = 0;
                local_210 = 1;
                goto LAB_0076f417;
              }
              __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator->(&local_28);
              pcVar9 = (char *)std::__cxx11::string::c_str();
              local_f1 = cmSystemTools::IsOn(pcVar9);
            }
            else {
              pbVar8 = __gnu_cxx::
                       __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator*(&local_28);
              bVar4 = std::operator==(pbVar8,"TLS_CAINFO");
              if (bVar4) {
                __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++(&local_28);
                local_2d8._M_current =
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end(i._M_current);
                bVar4 = __gnu_cxx::operator!=(&local_28,&local_2d8);
                if (!bVar4) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)&local_2f8,"TLS_CAFILE missing file value.",&local_2f9);
                  cmCommand::SetError(&this->super_cmCommand,&local_2f8);
                  std::__cxx11::string::~string((string *)&local_2f8);
                  std::allocator<char>::~allocator((allocator<char> *)&local_2f9);
                  this_local._7_1_ = 0;
                  local_210 = 1;
                  goto LAB_0076f417;
                }
                __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator->(&local_28);
                local_128 = (char *)std::__cxx11::string::c_str();
              }
              else {
                pbVar8 = __gnu_cxx::
                         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator*(&local_28);
                bVar4 = std::operator==(pbVar8,"EXPECTED_MD5");
                if (bVar4) {
                  __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator++(&local_28);
                  local_308._M_current =
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::end(i._M_current);
                  bVar4 = __gnu_cxx::operator==(&local_28,&local_308);
                  if (bVar4) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              ((string *)&local_328,"DOWNLOAD missing sum value for EXPECTED_MD5.",
                               &local_329);
                    cmCommand::SetError(&this->super_cmCommand,&local_328);
                    std::__cxx11::string::~string((string *)&local_328);
                    std::allocator<char>::~allocator((allocator<char> *)&local_329);
                    this_local._7_1_ = 0;
                    local_210 = 1;
                    goto LAB_0076f417;
                  }
                  pcVar14 = (cmCryptoHash *)operator_new(0x10);
                  cmCryptoHash::cmCryptoHash(pcVar14,AlgoMD5);
                  ::cm::auto_ptr<cmCryptoHash>::auto_ptr
                            ((auto_ptr<cmCryptoHash> *)local_340,pcVar14);
                  local_338 = (cmCryptoHash *)
                              ::cm::auto_ptr::operator_cast_to_auto_ptr_ref(local_340);
                  ::cm::auto_ptr<cmCryptoHash>::operator=
                            ((auto_ptr<cmCryptoHash> *)&stack0xfffffffffffffe68,
                             (auto_ptr_ref<cmCryptoHash>)local_338);
                  ::cm::auto_ptr<cmCryptoHash>::~auto_ptr((auto_ptr<cmCryptoHash> *)local_340);
                  std::__cxx11::string::operator=((string *)&hash,"MD5 sum");
                  pbVar8 = __gnu_cxx::
                           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator*(&local_28);
                  cmsys::SystemTools::LowerCase(&local_360,pbVar8);
                  std::__cxx11::string::operator=
                            ((string *)(hashMatchMSG.field_2._M_local_buf + 8),(string *)&local_360)
                  ;
                  std::__cxx11::string::~string((string *)&local_360);
                }
                else {
                  pbVar8 = __gnu_cxx::
                           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator*(&local_28);
                  bVar4 = std::operator==(pbVar8,"SHOW_PROGRESS");
                  if (bVar4) {
                    bVar3 = true;
                  }
                  else {
                    pbVar8 = __gnu_cxx::
                             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             ::operator*(&local_28);
                    bVar4 = std::operator==(pbVar8,"EXPECTED_HASH");
                    if (bVar4) {
                      __gnu_cxx::
                      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      ::operator++(&local_28);
                      local_368._M_current =
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::end(i._M_current);
                      bVar4 = __gnu_cxx::operator==(&local_28,&local_368);
                      if (bVar4) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string
                                  ((string *)&local_388,
                                   "DOWNLOAD missing ALGO=value for EXPECTED_HASH.",
                                   (allocator *)((long)&pos + 7));
                        cmCommand::SetError(&this->super_cmCommand,&local_388);
                        std::__cxx11::string::~string((string *)&local_388);
                        std::allocator<char>::~allocator((allocator<char> *)((long)&pos + 7));
                        this_local._7_1_ = 0;
                        local_210 = 1;
                        goto LAB_0076f417;
                      }
                      pbVar10 = __gnu_cxx::
                                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ::operator->(&local_28);
                      err.field_2._8_8_ = std::__cxx11::string::find((char *)pbVar10,0xbce3e0);
                      if (err.field_2._8_8_ == -1) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string
                                  ((string *)local_3b8,
                                   "DOWNLOAD EXPECTED_HASH expects ALGO=value but got: ",
                                   (allocator *)(algo.field_2._M_local_buf + 0xf));
                        std::allocator<char>::~allocator
                                  ((allocator<char> *)(algo.field_2._M_local_buf + 0xf));
                        pbVar8 = __gnu_cxx::
                                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ::operator*(&local_28);
                        std::__cxx11::string::operator+=((string *)local_3b8,(string *)pbVar8);
                        cmCommand::SetError(&this->super_cmCommand,(string *)local_3b8);
                        this_local._7_1_ = 0;
                        local_210 = 1;
                        std::__cxx11::string::~string((string *)local_3b8);
                        goto LAB_0076f417;
                      }
                      pbVar10 = __gnu_cxx::
                                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ::operator->(&local_28);
                      std::__cxx11::string::substr((ulong)local_3e0,(ulong)pbVar10);
                      pbVar10 = __gnu_cxx::
                                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ::operator->(&local_28);
                      std::__cxx11::string::substr((ulong)&local_420,(ulong)pbVar10);
                      cmsys::SystemTools::LowerCase(&local_400,&local_420);
                      std::__cxx11::string::operator=
                                ((string *)(hashMatchMSG.field_2._M_local_buf + 8),
                                 (string *)&local_400);
                      std::__cxx11::string::~string((string *)&local_400);
                      std::__cxx11::string::~string((string *)&local_420);
                      pcVar9 = (char *)std::__cxx11::string::c_str();
                      cmCryptoHash::New((cmCryptoHash *)((long)&err_1.field_2 + 8),pcVar9);
                      r = ::cm::auto_ptr::operator_cast_to_auto_ptr_ref
                                    ((auto_ptr *)(err_1.field_2._M_local_buf + 8));
                      ::cm::auto_ptr<cmCryptoHash>::auto_ptr(&local_430,r);
                      local_428 = (cmCryptoHash *)
                                  ::cm::auto_ptr::operator_cast_to_auto_ptr_ref
                                            ((auto_ptr *)&local_430);
                      ::cm::auto_ptr<cmCryptoHash>::operator=
                                ((auto_ptr<cmCryptoHash> *)&stack0xfffffffffffffe68,
                                 (auto_ptr_ref<cmCryptoHash>)local_428);
                      ::cm::auto_ptr<cmCryptoHash>::~auto_ptr(&local_430);
                      ::cm::auto_ptr<cmCryptoHash>::~auto_ptr
                                ((auto_ptr<cmCryptoHash> *)((long)&err_1.field_2 + 8));
                      pcVar14 = ::cm::auto_ptr<cmCryptoHash>::get
                                          ((auto_ptr<cmCryptoHash> *)&stack0xfffffffffffffe68);
                      if (pcVar14 == (cmCryptoHash *)0x0) {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string
                                  ((string *)local_460,"DOWNLOAD EXPECTED_HASH given unknown ALGO: "
                                   ,&local_461);
                        std::allocator<char>::~allocator((allocator<char> *)&local_461);
                        std::__cxx11::string::operator+=((string *)local_460,(string *)local_3e0);
                        cmCommand::SetError(&this->super_cmCommand,(string *)local_460);
                        this_local._7_1_ = 0;
                        local_210 = 1;
                        std::__cxx11::string::~string((string *)local_460);
                      }
                      else {
                        std::operator+(&local_488,
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)local_3e0," hash");
                        std::__cxx11::string::operator=((string *)&hash,(string *)&local_488);
                        std::__cxx11::string::~string((string *)&local_488);
                        local_210 = 0;
                      }
                      std::__cxx11::string::~string((string *)local_3e0);
                      if (local_210 != 0) goto LAB_0076f417;
                    }
                    else {
                      pbVar8 = __gnu_cxx::
                               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ::operator*(&local_28);
                      bVar4 = std::operator==(pbVar8,"USERPWD");
                      if (bVar4) {
                        __gnu_cxx::
                        __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator++(&local_28);
                        local_490._M_current =
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::end(i._M_current);
                        bVar4 = __gnu_cxx::operator==(&local_28,&local_490);
                        if (bVar4) {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string
                                    ((string *)&local_4b0,"DOWNLOAD missing string for USERPWD.",
                                     &local_4b1);
                          cmCommand::SetError(&this->super_cmCommand,&local_4b0);
                          std::__cxx11::string::~string((string *)&local_4b0);
                          std::allocator<char>::~allocator((allocator<char> *)&local_4b1);
                          this_local._7_1_ = 0;
                          local_210 = 1;
                          goto LAB_0076f417;
                        }
                        pbVar8 = __gnu_cxx::
                                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ::operator*(&local_28);
                        std::__cxx11::string::operator=
                                  ((string *)
                                   &curl_headers.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (string *)pbVar8);
                      }
                      else {
                        pbVar8 = __gnu_cxx::
                                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ::operator*(&local_28);
                        bVar4 = std::operator==(pbVar8,"HTTPHEADER");
                        if (bVar4) {
                          __gnu_cxx::
                          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::operator++(&local_28);
                          local_4c0._M_current =
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::end(i._M_current);
                          bVar4 = __gnu_cxx::operator==(&local_28,&local_4c0);
                          if (bVar4) {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string
                                      ((string *)&local_4e0,
                                       "DOWNLOAD missing string for HTTPHEADER.",
                                       (allocator *)(err_2.field_2._M_local_buf + 0xf));
                            cmCommand::SetError(&this->super_cmCommand,&local_4e0);
                            std::__cxx11::string::~string((string *)&local_4e0);
                            std::allocator<char>::~allocator
                                      ((allocator<char> *)(err_2.field_2._M_local_buf + 0xf));
                            this_local._7_1_ = 0;
                            local_210 = 1;
                            goto LAB_0076f417;
                          }
                          pbVar8 = __gnu_cxx::
                                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ::operator*(&local_28);
                          std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       *)local_1d8,pbVar8);
                        }
                        else {
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string
                                    ((string *)local_508,"Unexpected argument: ",
                                     (allocator *)(msg.field_2._M_local_buf + 0xf));
                          std::allocator<char>::~allocator
                                    ((allocator<char> *)(msg.field_2._M_local_buf + 0xf));
                          pbVar8 = __gnu_cxx::
                                   __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ::operator*(&local_28);
                          std::__cxx11::string::operator+=((string *)local_508,(string *)pbVar8);
                          cmMakefile::IssueMessage
                                    ((this->super_cmCommand).Makefile,AUTHOR_WARNING,
                                     (string *)local_508);
                          std::__cxx11::string::~string((string *)local_508);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_28);
  }
  pcVar9 = (char *)std::__cxx11::string::c_str();
  bVar4 = cmsys::SystemTools::FileExists(pcVar9);
  if ((bVar4) &&
     (pcVar14 = ::cm::auto_ptr<cmCryptoHash>::get
                          ((auto_ptr<cmCryptoHash> *)&stack0xfffffffffffffe68),
     pcVar14 != (cmCryptoHash *)0x0)) {
    std::__cxx11::string::string((string *)(actualHash.field_2._M_local_buf + 8));
    pcVar14 = ::cm::auto_ptr<cmCryptoHash>::operator->
                        ((auto_ptr<cmCryptoHash> *)&stack0xfffffffffffffe68);
    cmCryptoHash::HashFile((string *)local_550,pcVar14,(string *)&timeout);
    _Var5 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_550,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&hashMatchMSG.field_2 + 8));
    if (_Var5) {
      std::__cxx11::string::operator=
                ((string *)(actualHash.field_2._M_local_buf + 8),
                 "returning early; file already exists with expected ");
      std::__cxx11::string::operator+=
                ((string *)(actualHash.field_2._M_local_buf + 8),(string *)&hash);
      std::__cxx11::string::operator+=((string *)(actualHash.field_2._M_local_buf + 8),"\"");
      uVar12 = std::__cxx11::string::empty();
      if ((uVar12 & 1) == 0) {
        std::__cxx11::ostringstream::ostringstream(local_6c8);
        poVar13 = (ostream *)std::ostream::operator<<(local_6c8,0);
        poVar13 = std::operator<<(poVar13,";\"");
        std::operator<<(poVar13,(string *)(actualHash.field_2._M_local_buf + 8));
        pcVar1 = (this->super_cmCommand).Makefile;
        std::__cxx11::ostringstream::str();
        pcVar9 = (char *)std::__cxx11::string::c_str();
        cmMakefile::AddDefinition(pcVar1,(string *)local_f0,pcVar9);
        std::__cxx11::string::~string((string *)(dir.field_2._M_local_buf + 8));
        std::__cxx11::ostringstream::~ostringstream(local_6c8);
      }
      this_local._7_1_ = 1;
      local_210 = 1;
    }
    else {
      local_210 = 0;
    }
    std::__cxx11::string::~string((string *)local_550);
    std::__cxx11::string::~string((string *)(actualHash.field_2._M_local_buf + 8));
    if (local_210 == 0) goto LAB_0076d5a2;
  }
  else {
LAB_0076d5a2:
    cmsys::SystemTools::GetFilenamePath((string *)((long)&errstring.field_2 + 8),(string *)&timeout)
    ;
    pcVar9 = (char *)std::__cxx11::string::c_str();
    bVar4 = cmsys::SystemTools::FileExists(pcVar9);
    if (bVar4) {
LAB_0076d6d2:
      pcVar9 = (char *)std::__cxx11::string::c_str();
      std::ofstream::ofstream(&local_948,pcVar9,_S_bin);
      bVar6 = std::ios::operator!((ios *)((long)&local_948 + *(long *)(local_948 + -0x18)));
      if ((bVar6 & 1) == 0) {
        curl_global_init(3);
        local_978 = curl_easy_init();
        if (local_978 == (CURL_conflict *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_998,"DOWNLOAD error initializing curl.",
                     (allocator *)((long)&g_curl.Easy + 7));
          cmCommand::SetError(&this->super_cmCommand,&local_998);
          std::__cxx11::string::~string((string *)&local_998);
          std::allocator<char>::~allocator((allocator<char> *)((long)&g_curl.Easy + 7));
          this_local._7_1_ = 0;
          local_210 = 1;
        }
        else {
          anon_unknown.dwarf_49c470::cURLEasyGuard::cURLEasyGuard
                    ((cURLEasyGuard *)&stack0xfffffffffffff658,local_978);
          pCVar2 = local_978;
          uVar11 = std::__cxx11::string::c_str();
          e.field_2._12_4_ = curl_easy_setopt(pCVar2,CURLOPT_URL,uVar11);
          if (e.field_2._12_4_ == CURLE_OK) {
            e.field_2._12_4_ = curl_easy_setopt(local_978,CURLOPT_FAILONERROR,1);
            if (e.field_2._12_4_ == CURLE_OK) {
              e.field_2._12_4_ = curl_easy_setopt(local_978,CURLOPT_USERAGENT,"curl/7.54.1");
              if (e.field_2._12_4_ == CURLE_OK) {
                e.field_2._12_4_ =
                     curl_easy_setopt(local_978,CURLOPT_WRITEFUNCTION,
                                      anon_unknown.dwarf_49c470::cmWriteToFileCallback);
                if (e.field_2._12_4_ == CURLE_OK) {
                  e.field_2._12_4_ =
                       curl_easy_setopt(local_978,CURLOPT_DEBUGFUNCTION,
                                        anon_unknown.dwarf_49c470::cmFileCommandCurlDebugCallback);
                  if (e.field_2._12_4_ == CURLE_OK) {
                    if ((local_f1 & 1) == 0) {
                      e.field_2._12_4_ = curl_easy_setopt(local_978,CURLOPT_SSL_VERIFYPEER,0);
                      if (e.field_2._12_4_ == CURLE_OK) goto LAB_0076e055;
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string
                                ((string *)local_ac0,"Unable to set TLS/SSL Verify off: ",
                                 (allocator *)((long)&cainfo_err + 7));
                      std::allocator<char>::~allocator((allocator<char> *)((long)&cainfo_err + 7));
                      pcVar9 = curl_easy_strerror(e.field_2._12_4_);
                      std::__cxx11::string::operator+=((string *)local_ac0,pcVar9);
                      cmCommand::SetError(&this->super_cmCommand,(string *)local_ac0);
                      this_local._7_1_ = 0;
                      local_210 = 1;
                      std::__cxx11::string::~string((string *)local_ac0);
                    }
                    else {
                      e.field_2._12_4_ = curl_easy_setopt(local_978,CURLOPT_SSL_VERIFYPEER,1);
                      if (e.field_2._12_4_ == CURLE_OK) {
LAB_0076e055:
                        cmCurlSetCAInfo_abi_cxx11_
                                  ((string *)
                                   &chunkDebug.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.field_0x10,local_978,local_128);
                        uVar12 = std::__cxx11::string::empty();
                        if ((uVar12 & 1) == 0) {
                          cmCommand::SetError(&this->super_cmCommand,
                                              (string *)
                                              &chunkDebug.
                                               super__Vector_base<char,_std::allocator<char>_>.
                                               _M_impl.field_0x10);
                          this_local._7_1_ = 0;
                          local_210 = 1;
                        }
                        else {
                          std::vector<char,_std::allocator<char>_>::vector
                                    ((vector<char,_std::allocator<char>_> *)((long)&e_7.field_2 + 8)
                                    );
                          e.field_2._12_4_ =
                               curl_easy_setopt(local_978,CURLOPT_WRITEDATA,&local_948);
                          if (e.field_2._12_4_ == CURLE_OK) {
                            e.field_2._12_4_ =
                                 curl_easy_setopt(local_978,CURLOPT_DEBUGDATA,
                                                  (undefined1 *)((long)&e_7.field_2 + 8));
                            if (e.field_2._12_4_ == CURLE_OK) {
                              e.field_2._12_4_ =
                                   curl_easy_setopt(local_978,CURLOPT_FOLLOWLOCATION,1);
                              if (e.field_2._12_4_ == CURLE_OK) {
                                uVar12 = std::__cxx11::string::empty();
                                if ((uVar12 & 1) == 0) {
                                  e.field_2._12_4_ = curl_easy_setopt(local_978,CURLOPT_VERBOSE,1);
                                  if (e.field_2._12_4_ != CURLE_OK) {
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string
                                              ((string *)local_ba0,"DOWNLOAD cannot set verbose: ",
                                               (allocator *)(e_11.field_2._M_local_buf + 0xf));
                                    std::allocator<char>::~allocator
                                              ((allocator<char> *)(e_11.field_2._M_local_buf + 0xf))
                                    ;
                                    pcVar9 = curl_easy_strerror(e.field_2._12_4_);
                                    std::__cxx11::string::operator+=((string *)local_ba0,pcVar9);
                                    cmCommand::SetError(&this->super_cmCommand,(string *)local_ba0);
                                    this_local._7_1_ = 0;
                                    local_210 = 1;
                                    std::__cxx11::string::~string((string *)local_ba0);
                                    goto LAB_0076f38b;
                                  }
                                  e.field_2._12_4_ = 0;
                                }
                                if (0 < inactivity_timeout) {
                                  e.field_2._12_4_ =
                                       curl_easy_setopt(local_978,CURLOPT_TIMEOUT,inactivity_timeout
                                                       );
                                  if (e.field_2._12_4_ != CURLE_OK) {
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string
                                              ((string *)local_bc8,"DOWNLOAD cannot set timeout: ",
                                               (allocator *)(helper.Text.field_2._M_local_buf + 0xf)
                                              );
                                    std::allocator<char>::~allocator
                                              ((allocator<char> *)
                                               (helper.Text.field_2._M_local_buf + 0xf));
                                    pcVar9 = curl_easy_strerror(e.field_2._12_4_);
                                    std::__cxx11::string::operator+=((string *)local_bc8,pcVar9);
                                    cmCommand::SetError(&this->super_cmCommand,(string *)local_bc8);
                                    this_local._7_1_ = 0;
                                    local_210 = 1;
                                    std::__cxx11::string::~string((string *)local_bc8);
                                    goto LAB_0076f38b;
                                  }
                                  e.field_2._12_4_ = 0;
                                }
                                if (0 < (long)logVar.field_2._8_8_) {
                                  curl_easy_setopt(local_978,CURLOPT_LOW_SPEED_LIMIT,1);
                                  curl_easy_setopt(local_978,CURLOPT_LOW_SPEED_TIME,
                                                   logVar.field_2._8_8_);
                                }
                                anon_unknown.dwarf_49c470::cURLProgressHelper::cURLProgressHelper
                                          ((cURLProgressHelper *)((long)&e_12.field_2 + 8),this,
                                           "download");
                                if (bVar3) {
                                  e.field_2._12_4_ =
                                       curl_easy_setopt(local_978,CURLOPT_NOPROGRESS,0);
                                  if (e.field_2._12_4_ == CURLE_OK) {
                                    e.field_2._12_4_ =
                                         curl_easy_setopt(local_978,CURLOPT_PROGRESSFUNCTION,
                                                          anon_unknown.dwarf_49c470::
                                                          cmFileDownloadProgressCallback);
                                    if (e.field_2._12_4_ == CURLE_OK) {
                                      e.field_2._12_4_ =
                                           curl_easy_setopt(local_978,CURLOPT_PROGRESSDATA,
                                                            (undefined1 *)((long)&e_12.field_2 + 8))
                                      ;
                                      if (e.field_2._12_4_ == CURLE_OK) {
                                        e.field_2._12_4_ = 0;
                                        goto LAB_0076e9e8;
                                      }
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string
                                                ((string *)local_c70,
                                                 "DOWNLOAD cannot set progress data: ",
                                                 (allocator *)(e_15.field_2._M_local_buf + 0xf));
                                      std::allocator<char>::~allocator
                                                ((allocator<char> *)
                                                 (e_15.field_2._M_local_buf + 0xf));
                                      pcVar9 = curl_easy_strerror(e.field_2._12_4_);
                                      std::__cxx11::string::operator+=((string *)local_c70,pcVar9);
                                      cmCommand::SetError(&this->super_cmCommand,(string *)local_c70
                                                         );
                                      this_local._7_1_ = 0;
                                      local_210 = 1;
                                      std::__cxx11::string::~string((string *)local_c70);
                                    }
                                    else {
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string
                                                ((string *)local_c48,
                                                 "DOWNLOAD cannot set progress function: ",
                                                 (allocator *)(e_14.field_2._M_local_buf + 0xf));
                                      std::allocator<char>::~allocator
                                                ((allocator<char> *)
                                                 (e_14.field_2._M_local_buf + 0xf));
                                      pcVar9 = curl_easy_strerror(e.field_2._12_4_);
                                      std::__cxx11::string::operator+=((string *)local_c48,pcVar9);
                                      cmCommand::SetError(&this->super_cmCommand,(string *)local_c48
                                                         );
                                      this_local._7_1_ = 0;
                                      local_210 = 1;
                                      std::__cxx11::string::~string((string *)local_c48);
                                    }
                                  }
                                  else {
                                    std::allocator<char>::allocator();
                                    std::__cxx11::string::string
                                              ((string *)local_c20,
                                               "DOWNLOAD cannot set noprogress value: ",
                                               (allocator *)(e_13.field_2._M_local_buf + 0xf));
                                    std::allocator<char>::~allocator
                                              ((allocator<char> *)(e_13.field_2._M_local_buf + 0xf))
                                    ;
                                    pcVar9 = curl_easy_strerror(e.field_2._12_4_);
                                    std::__cxx11::string::operator+=((string *)local_c20,pcVar9);
                                    cmCommand::SetError(&this->super_cmCommand,(string *)local_c20);
                                    this_local._7_1_ = 0;
                                    local_210 = 1;
                                    std::__cxx11::string::~string((string *)local_c20);
                                  }
                                }
                                else {
LAB_0076e9e8:
                                  uVar12 = std::__cxx11::string::empty();
                                  pCVar2 = local_978;
                                  if ((uVar12 & 1) == 0) {
                                    uVar11 = std::__cxx11::string::c_str();
                                    e.field_2._12_4_ =
                                         curl_easy_setopt(pCVar2,CURLOPT_USERPWD,uVar11);
                                    if (e.field_2._12_4_ != CURLE_OK) {
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string
                                                ((string *)local_c98,
                                                 "DOWNLOAD cannot set user password: ",
                                                 (allocator *)((long)&headers + 7));
                                      std::allocator<char>::~allocator
                                                ((allocator<char> *)((long)&headers + 7));
                                      pcVar9 = curl_easy_strerror(e.field_2._12_4_);
                                      std::__cxx11::string::operator+=((string *)local_c98,pcVar9);
                                      cmCommand::SetError(&this->super_cmCommand,(string *)local_c98
                                                         );
                                      this_local._7_1_ = 0;
                                      local_210 = 1;
                                      std::__cxx11::string::~string((string *)local_c98);
                                      goto LAB_0076f36f;
                                    }
                                    e.field_2._12_4_ = 0;
                                  }
                                  h._M_current = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)0x0;
                                  local_cb8._M_current =
                                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)std::
                                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ::begin((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_1d8);
                                  __gnu_cxx::
                                  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                                  ::__normal_iterator<std::__cxx11::string*>
                                            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                                              *)&local_cb0,&local_cb8);
                                  while( true ) {
                                    local_cc0._M_current =
                                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)std::
                                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ::end((
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  *)local_1d8);
                                    bVar3 = __gnu_cxx::operator!=(&local_cb0,&local_cc0);
                                    list = h;
                                    if (!bVar3) break;
                                    __gnu_cxx::
                                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ::operator->(&local_cb0);
                                    pcVar9 = (char *)std::__cxx11::string::c_str();
                                    h._M_current = (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)curl_slist_append(list._M_current,pcVar9);
                                    __gnu_cxx::
                                    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                    ::operator++(&local_cb0);
                                  }
                                  curl_easy_setopt(local_978,CURLOPT_HTTPHEADER,h._M_current);
                                  e.field_2._12_4_ = curl_easy_perform(local_978);
                                  curl_slist_free_all((curl_slist *)h._M_current);
                                  anon_unknown.dwarf_49c470::cURLEasyGuard::release
                                            ((cURLEasyGuard *)&stack0xfffffffffffff658);
                                  curl_easy_cleanup(local_978);
                                  uVar12 = std::__cxx11::string::empty();
                                  if ((uVar12 & 1) == 0) {
                                    std::__cxx11::ostringstream::ostringstream(local_e38);
                                    poVar13 = (ostream *)
                                              std::ostream::operator<<(local_e38,e.field_2._12_4_);
                                    poVar13 = std::operator<<(poVar13,";\"");
                                    pcVar9 = curl_easy_strerror(e.field_2._12_4_);
                                    poVar13 = std::operator<<(poVar13,pcVar9);
                                    std::operator<<(poVar13,"\"");
                                    pcVar1 = (this->super_cmCommand).Makefile;
                                    std::__cxx11::ostringstream::str();
                                    pcVar9 = (char *)std::__cxx11::string::c_str();
                                    cmMakefile::AddDefinition(pcVar1,(string *)local_f0,pcVar9);
                                    std::__cxx11::string::~string
                                              ((string *)(actualHash_1.field_2._M_local_buf + 8));
                                    std::__cxx11::ostringstream::~ostringstream(local_e38);
                                  }
                                  curl_global_cleanup();
                                  std::ostream::flush();
                                  std::ofstream::close();
                                  pcVar14 = ::cm::auto_ptr<cmCryptoHash>::get
                                                      ((auto_ptr<cmCryptoHash> *)
                                                       &stack0xfffffffffffffe68);
                                  if (pcVar14 != (cmCryptoHash *)0x0) {
                                    pcVar14 = ::cm::auto_ptr<cmCryptoHash>::operator->
                                                        ((auto_ptr<cmCryptoHash> *)
                                                         &stack0xfffffffffffffe68);
                                    cmCryptoHash::HashFile
                                              ((string *)local_e78,pcVar14,(string *)&timeout);
                                    uVar12 = std::__cxx11::string::empty();
                                    if ((uVar12 & 1) == 0) {
                                      bVar3 = std::operator!=((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&hashMatchMSG.field_2 + 8),
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_e78);
                                      if (bVar3) {
                                        std::__cxx11::ostringstream::ostringstream
                                                  ((ostringstream *)
                                                   (status.field_2._M_local_buf + 8));
                                        poVar13 = std::operator<<((ostream *)
                                                                  ((long)&status.field_2 + 8),
                                                                  "DOWNLOAD HASH mismatch");
                                        poVar13 = (ostream *)
                                                  std::ostream::operator<<
                                                            (poVar13,std::
                                                  endl<char,std::char_traits<char>>);
                                        poVar13 = std::operator<<(poVar13,"  for file: [");
                                        poVar13 = std::operator<<(poVar13,(string *)&timeout);
                                        poVar13 = std::operator<<(poVar13,"]");
                                        poVar13 = (ostream *)
                                                  std::ostream::operator<<
                                                            (poVar13,std::
                                                  endl<char,std::char_traits<char>>);
                                        poVar13 = std::operator<<(poVar13,"    expected hash: [");
                                        poVar13 = std::operator<<(poVar13,(string *)
                                                                          (hashMatchMSG.field_2.
                                                                           _M_local_buf + 8));
                                        poVar13 = std::operator<<(poVar13,"]");
                                        poVar13 = (ostream *)
                                                  std::ostream::operator<<
                                                            (poVar13,std::
                                                  endl<char,std::char_traits<char>>);
                                        poVar13 = std::operator<<(poVar13,"      actual hash: [");
                                        poVar13 = std::operator<<(poVar13,(string *)local_e78);
                                        poVar13 = std::operator<<(poVar13,"]");
                                        poVar13 = (ostream *)
                                                  std::ostream::operator<<
                                                            (poVar13,std::
                                                  endl<char,std::char_traits<char>>);
                                        poVar13 = std::operator<<(poVar13,"           status: [");
                                        poVar13 = (ostream *)
                                                  std::ostream::operator<<(poVar13,e.field_2._12_4_)
                                        ;
                                        poVar13 = std::operator<<(poVar13,";\"");
                                        pcVar9 = curl_easy_strerror(e.field_2._12_4_);
                                        poVar13 = std::operator<<(poVar13,pcVar9);
                                        poVar13 = std::operator<<(poVar13,"\"]");
                                        std::ostream::operator<<
                                                  (poVar13,std::endl<char,std::char_traits<char>>);
                                        uVar12 = std::__cxx11::string::empty();
                                        if (((uVar12 & 1) == 0) && (e.field_2._12_4_ == 0)) {
                                          std::operator+(&local_1078,"1;HASH mismatch: expected: ",
                                                         (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&hashMatchMSG.field_2 + 8));
                                          std::operator+(&local_1058,&local_1078," actual: ");
                                          std::operator+((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_1038,&local_1058,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_e78);
                                          std::__cxx11::string::~string((string *)&local_1058);
                                          std::__cxx11::string::~string((string *)&local_1078);
                                          pcVar1 = (this->super_cmCommand).Makefile;
                                          pcVar9 = (char *)std::__cxx11::string::c_str();
                                          cmMakefile::AddDefinition
                                                    (pcVar1,(string *)local_f0,pcVar9);
                                          std::__cxx11::string::~string((string *)local_1038);
                                        }
                                        std::__cxx11::ostringstream::str();
                                        cmCommand::SetError(&this->super_cmCommand,&local_1098);
                                        std::__cxx11::string::~string((string *)&local_1098);
                                        this_local._7_1_ = 0;
                                        local_210 = 1;
                                        std::__cxx11::ostringstream::~ostringstream
                                                  ((ostringstream *)
                                                   (status.field_2._M_local_buf + 8));
                                      }
                                      else {
                                        local_210 = 0;
                                      }
                                    }
                                    else {
                                      std::allocator<char>::allocator();
                                      std::__cxx11::string::string
                                                ((string *)&local_e98,
                                                 "DOWNLOAD cannot compute hash on downloaded file",
                                                 &local_e99);
                                      cmCommand::SetError(&this->super_cmCommand,&local_e98);
                                      std::__cxx11::string::~string((string *)&local_e98);
                                      std::allocator<char>::~allocator
                                                ((allocator<char> *)&local_e99);
                                      this_local._7_1_ = 0;
                                      local_210 = 1;
                                    }
                                    std::__cxx11::string::~string((string *)local_e78);
                                    if (local_210 != 0) goto LAB_0076f36f;
                                  }
                                  uVar12 = std::__cxx11::string::empty();
                                  if ((uVar12 & 1) == 0) {
                                    local_1099 = '\0';
                                    std::vector<char,_std::allocator<char>_>::push_back
                                              ((vector<char,_std::allocator<char>_> *)
                                               ((long)&e_7.field_2 + 8),&local_1099);
                                    pcVar1 = (this->super_cmCommand).Makefile;
                                    local_10a8._M_current =
                                         (char *)std::vector<char,_std::allocator<char>_>::begin
                                                           ((vector<char,_std::allocator<char>_> *)
                                                            ((long)&e_7.field_2 + 8));
                                    value = __gnu_cxx::
                                            __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_>
                                            ::operator*(&local_10a8);
                                    cmMakefile::AddDefinition
                                              (pcVar1,(string *)((long)&statusVar.field_2 + 8),value
                                              );
                                  }
                                  this_local._7_1_ = 1;
                                  local_210 = 1;
                                }
LAB_0076f36f:
                                anon_unknown.dwarf_49c470::cURLProgressHelper::~cURLProgressHelper
                                          ((cURLProgressHelper *)((long)&e_12.field_2 + 8));
                              }
                              else {
                                std::allocator<char>::allocator();
                                std::__cxx11::string::string
                                          ((string *)local_b78,
                                           "DOWNLOAD cannot set follow-redirect option: ",
                                           (allocator *)(e_10.field_2._M_local_buf + 0xf));
                                std::allocator<char>::~allocator
                                          ((allocator<char> *)(e_10.field_2._M_local_buf + 0xf));
                                pcVar9 = curl_easy_strerror(e.field_2._12_4_);
                                std::__cxx11::string::operator+=((string *)local_b78,pcVar9);
                                cmCommand::SetError(&this->super_cmCommand,(string *)local_b78);
                                this_local._7_1_ = 0;
                                local_210 = 1;
                                std::__cxx11::string::~string((string *)local_b78);
                              }
                            }
                            else {
                              std::allocator<char>::allocator();
                              std::__cxx11::string::string
                                        ((string *)local_b50,"DOWNLOAD cannot set debug data: ",
                                         (allocator *)(e_9.field_2._M_local_buf + 0xf));
                              std::allocator<char>::~allocator
                                        ((allocator<char> *)(e_9.field_2._M_local_buf + 0xf));
                              pcVar9 = curl_easy_strerror(e.field_2._12_4_);
                              std::__cxx11::string::operator+=((string *)local_b50,pcVar9);
                              cmCommand::SetError(&this->super_cmCommand,(string *)local_b50);
                              this_local._7_1_ = 0;
                              local_210 = 1;
                              std::__cxx11::string::~string((string *)local_b50);
                            }
                          }
                          else {
                            std::allocator<char>::allocator();
                            std::__cxx11::string::string
                                      ((string *)local_b28,"DOWNLOAD cannot set write data: ",
                                       (allocator *)(e_8.field_2._M_local_buf + 0xf));
                            std::allocator<char>::~allocator
                                      ((allocator<char> *)(e_8.field_2._M_local_buf + 0xf));
                            pcVar9 = curl_easy_strerror(e.field_2._12_4_);
                            std::__cxx11::string::operator+=((string *)local_b28,pcVar9);
                            cmCommand::SetError(&this->super_cmCommand,(string *)local_b28);
                            this_local._7_1_ = 0;
                            local_210 = 1;
                            std::__cxx11::string::~string((string *)local_b28);
                          }
LAB_0076f38b:
                          std::vector<char,_std::allocator<char>_>::~vector
                                    ((vector<char,_std::allocator<char>_> *)((long)&e_7.field_2 + 8)
                                    );
                        }
                        std::__cxx11::string::~string
                                  ((string *)
                                   &chunkDebug.super__Vector_base<char,_std::allocator<char>_>.
                                    _M_impl.field_0x10);
                      }
                      else {
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string
                                  ((string *)local_a98,"Unable to set TLS/SSL Verify on: ",
                                   (allocator *)(e_6.field_2._M_local_buf + 0xf));
                        std::allocator<char>::~allocator
                                  ((allocator<char> *)(e_6.field_2._M_local_buf + 0xf));
                        pcVar9 = curl_easy_strerror(e.field_2._12_4_);
                        std::__cxx11::string::operator+=((string *)local_a98,pcVar9);
                        cmCommand::SetError(&this->super_cmCommand,(string *)local_a98);
                        this_local._7_1_ = 0;
                        local_210 = 1;
                        std::__cxx11::string::~string((string *)local_a98);
                      }
                    }
                  }
                  else {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              ((string *)local_a70,"DOWNLOAD cannot set debug function: ",
                               (allocator *)(e_5.field_2._M_local_buf + 0xf));
                    std::allocator<char>::~allocator
                              ((allocator<char> *)(e_5.field_2._M_local_buf + 0xf));
                    pcVar9 = curl_easy_strerror(e.field_2._12_4_);
                    std::__cxx11::string::operator+=((string *)local_a70,pcVar9);
                    cmCommand::SetError(&this->super_cmCommand,(string *)local_a70);
                    this_local._7_1_ = 0;
                    local_210 = 1;
                    std::__cxx11::string::~string((string *)local_a70);
                  }
                }
                else {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string
                            ((string *)local_a48,"DOWNLOAD cannot set write function: ",
                             (allocator *)(e_4.field_2._M_local_buf + 0xf));
                  std::allocator<char>::~allocator
                            ((allocator<char> *)(e_4.field_2._M_local_buf + 0xf));
                  pcVar9 = curl_easy_strerror(e.field_2._12_4_);
                  std::__cxx11::string::operator+=((string *)local_a48,pcVar9);
                  cmCommand::SetError(&this->super_cmCommand,(string *)local_a48);
                  this_local._7_1_ = 0;
                  local_210 = 1;
                  std::__cxx11::string::~string((string *)local_a48);
                }
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string
                          ((string *)local_a20,"DOWNLOAD cannot set user agent option: ",
                           (allocator *)(e_3.field_2._M_local_buf + 0xf));
                std::allocator<char>::~allocator
                          ((allocator<char> *)(e_3.field_2._M_local_buf + 0xf));
                pcVar9 = curl_easy_strerror(e.field_2._12_4_);
                std::__cxx11::string::operator+=((string *)local_a20,pcVar9);
                cmCommand::SetError(&this->super_cmCommand,(string *)local_a20);
                this_local._7_1_ = 0;
                local_210 = 1;
                std::__cxx11::string::~string((string *)local_a20);
              }
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string
                        ((string *)local_9f8,"DOWNLOAD cannot set http failure option: ",
                         (allocator *)(e_2.field_2._M_local_buf + 0xf));
              std::allocator<char>::~allocator((allocator<char> *)(e_2.field_2._M_local_buf + 0xf));
              pcVar9 = curl_easy_strerror(e.field_2._12_4_);
              std::__cxx11::string::operator+=((string *)local_9f8,pcVar9);
              cmCommand::SetError(&this->super_cmCommand,(string *)local_9f8);
              this_local._7_1_ = 0;
              local_210 = 1;
              std::__cxx11::string::~string((string *)local_9f8);
            }
          }
          else {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)local_9d0,"DOWNLOAD cannot set url: ",
                       (allocator *)(e_1.field_2._M_local_buf + 0xf));
            std::allocator<char>::~allocator((allocator<char> *)(e_1.field_2._M_local_buf + 0xf));
            pcVar9 = curl_easy_strerror(e.field_2._12_4_);
            std::__cxx11::string::operator+=((string *)local_9d0,pcVar9);
            cmCommand::SetError(&this->super_cmCommand,(string *)local_9d0);
            this_local._7_1_ = 0;
            local_210 = 1;
            std::__cxx11::string::~string((string *)local_9d0);
          }
          anon_unknown.dwarf_49c470::cURLEasyGuard::~cURLEasyGuard
                    ((cURLEasyGuard *)&stack0xfffffffffffff658);
        }
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_968,"DOWNLOAD cannot open file for write.",
                   (allocator *)((long)&curl + 7));
        cmCommand::SetError(&this->super_cmCommand,&local_968);
        std::__cxx11::string::~string((string *)&local_968);
        std::allocator<char>::~allocator((allocator<char> *)((long)&curl + 7));
        this_local._7_1_ = 0;
        local_210 = 1;
      }
      std::ofstream::~ofstream(&local_948);
    }
    else {
      pcVar9 = (char *)std::__cxx11::string::c_str();
      bVar4 = cmsys::SystemTools::MakeDirectory(pcVar9);
      if (bVar4) goto LAB_0076d6d2;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &fout.field_0x1f8,"DOWNLOAD error: cannot create directory \'",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&errstring.field_2 + 8));
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_728,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &fout.field_0x1f8,
                     "\' - Specify file by full path name and verify that you have directory creation and file write privileges."
                    );
      std::__cxx11::string::~string((string *)&fout.field_0x1f8);
      cmCommand::SetError(&this->super_cmCommand,(string *)local_728);
      this_local._7_1_ = 0;
      local_210 = 1;
      std::__cxx11::string::~string((string *)local_728);
    }
    std::__cxx11::string::~string((string *)(errstring.field_2._M_local_buf + 8));
  }
LAB_0076f417:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_1d8);
  std::__cxx11::string::~string
            ((string *)
             &curl_headers.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::cm::auto_ptr<cmCryptoHash>::~auto_ptr((auto_ptr<cmCryptoHash> *)&stack0xfffffffffffffe68);
  std::__cxx11::string::~string((string *)&hash);
  std::__cxx11::string::~string((string *)(hashMatchMSG.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_f0);
  std::__cxx11::string::~string((string *)(statusVar.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&timeout);
  std::__cxx11::string::~string((string *)(file.field_2._M_local_buf + 8));
LAB_0076f4ed:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmFileCommand::HandleDownloadCommand(std::vector<std::string> const& args)
{
#if defined(CMAKE_BUILD_WITH_CMAKE)
  std::vector<std::string>::const_iterator i = args.begin();
  if (args.size() < 3) {
    this->SetError("DOWNLOAD must be called with at least three arguments.");
    return false;
  }
  ++i; // Get rid of subcommand
  std::string url = *i;
  ++i;
  std::string file = *i;
  ++i;

  long timeout = 0;
  long inactivity_timeout = 0;
  std::string logVar;
  std::string statusVar;
  bool tls_verify = this->Makefile->IsOn("CMAKE_TLS_VERIFY");
  const char* cainfo = this->Makefile->GetDefinition("CMAKE_TLS_CAINFO");
  std::string expectedHash;
  std::string hashMatchMSG;
  CM_AUTO_PTR<cmCryptoHash> hash;
  bool showProgress = false;
  std::string userpwd;

  std::vector<std::string> curl_headers;

  while (i != args.end()) {
    if (*i == "TIMEOUT") {
      ++i;
      if (i != args.end()) {
        timeout = atol(i->c_str());
      } else {
        this->SetError("DOWNLOAD missing time for TIMEOUT.");
        return false;
      }
    } else if (*i == "INACTIVITY_TIMEOUT") {
      ++i;
      if (i != args.end()) {
        inactivity_timeout = atol(i->c_str());
      } else {
        this->SetError("DOWNLOAD missing time for INACTIVITY_TIMEOUT.");
        return false;
      }
    } else if (*i == "LOG") {
      ++i;
      if (i == args.end()) {
        this->SetError("DOWNLOAD missing VAR for LOG.");
        return false;
      }
      logVar = *i;
    } else if (*i == "STATUS") {
      ++i;
      if (i == args.end()) {
        this->SetError("DOWNLOAD missing VAR for STATUS.");
        return false;
      }
      statusVar = *i;
    } else if (*i == "TLS_VERIFY") {
      ++i;
      if (i != args.end()) {
        tls_verify = cmSystemTools::IsOn(i->c_str());
      } else {
        this->SetError("TLS_VERIFY missing bool value.");
        return false;
      }
    } else if (*i == "TLS_CAINFO") {
      ++i;
      if (i != args.end()) {
        cainfo = i->c_str();
      } else {
        this->SetError("TLS_CAFILE missing file value.");
        return false;
      }
    } else if (*i == "EXPECTED_MD5") {
      ++i;
      if (i == args.end()) {
        this->SetError("DOWNLOAD missing sum value for EXPECTED_MD5.");
        return false;
      }
      hash =
        CM_AUTO_PTR<cmCryptoHash>(new cmCryptoHash(cmCryptoHash::AlgoMD5));
      hashMatchMSG = "MD5 sum";
      expectedHash = cmSystemTools::LowerCase(*i);
    } else if (*i == "SHOW_PROGRESS") {
      showProgress = true;
    } else if (*i == "EXPECTED_HASH") {
      ++i;
      if (i == args.end()) {
        this->SetError("DOWNLOAD missing ALGO=value for EXPECTED_HASH.");
        return false;
      }
      std::string::size_type pos = i->find("=");
      if (pos == std::string::npos) {
        std::string err =
          "DOWNLOAD EXPECTED_HASH expects ALGO=value but got: ";
        err += *i;
        this->SetError(err);
        return false;
      }
      std::string algo = i->substr(0, pos);
      expectedHash = cmSystemTools::LowerCase(i->substr(pos + 1));
      hash = CM_AUTO_PTR<cmCryptoHash>(cmCryptoHash::New(algo.c_str()));
      if (!hash.get()) {
        std::string err = "DOWNLOAD EXPECTED_HASH given unknown ALGO: ";
        err += algo;
        this->SetError(err);
        return false;
      }
      hashMatchMSG = algo + " hash";
    } else if (*i == "USERPWD") {
      ++i;
      if (i == args.end()) {
        this->SetError("DOWNLOAD missing string for USERPWD.");
        return false;
      }
      userpwd = *i;
    } else if (*i == "HTTPHEADER") {
      ++i;
      if (i == args.end()) {
        this->SetError("DOWNLOAD missing string for HTTPHEADER.");
        return false;
      }
      curl_headers.push_back(*i);
    } else {
      // Do not return error for compatibility reason.
      std::string err = "Unexpected argument: ";
      err += *i;
      this->Makefile->IssueMessage(cmake::AUTHOR_WARNING, err);
    }
    ++i;
  }
  // If file exists already, and caller specified an expected md5 or sha,
  // and the existing file already has the expected hash, then simply
  // return.
  //
  if (cmSystemTools::FileExists(file.c_str()) && hash.get()) {
    std::string msg;
    std::string actualHash = hash->HashFile(file);
    if (actualHash == expectedHash) {
      msg = "returning early; file already exists with expected ";
      msg += hashMatchMSG;
      msg += "\"";
      if (!statusVar.empty()) {
        std::ostringstream result;
        result << (int)0 << ";\"" << msg;
        this->Makefile->AddDefinition(statusVar, result.str().c_str());
      }
      return true;
    }
  }
  // Make sure parent directory exists so we can write to the file
  // as we receive downloaded bits from curl...
  //
  std::string dir = cmSystemTools::GetFilenamePath(file);
  if (!cmSystemTools::FileExists(dir.c_str()) &&
      !cmSystemTools::MakeDirectory(dir.c_str())) {
    std::string errstring = "DOWNLOAD error: cannot create directory '" + dir +
      "' - Specify file by full path name and verify that you "
      "have directory creation and file write privileges.";
    this->SetError(errstring);
    return false;
  }

  cmsys::ofstream fout(file.c_str(), std::ios::binary);
  if (!fout) {
    this->SetError("DOWNLOAD cannot open file for write.");
    return false;
  }

#if defined(_WIN32)
  url = fix_file_url_windows(url);
#endif

  ::CURL* curl;
  ::curl_global_init(CURL_GLOBAL_DEFAULT);
  curl = ::curl_easy_init();
  if (!curl) {
    this->SetError("DOWNLOAD error initializing curl.");
    return false;
  }

  cURLEasyGuard g_curl(curl);
  ::CURLcode res = ::curl_easy_setopt(curl, CURLOPT_URL, url.c_str());
  check_curl_result(res, "DOWNLOAD cannot set url: ");

  // enable HTTP ERROR parsing
  res = ::curl_easy_setopt(curl, CURLOPT_FAILONERROR, 1);
  check_curl_result(res, "DOWNLOAD cannot set http failure option: ");

  res = ::curl_easy_setopt(curl, CURLOPT_USERAGENT, "curl/" LIBCURL_VERSION);
  check_curl_result(res, "DOWNLOAD cannot set user agent option: ");

  res = ::curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION, cmWriteToFileCallback);
  check_curl_result(res, "DOWNLOAD cannot set write function: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGFUNCTION,
                           cmFileCommandCurlDebugCallback);
  check_curl_result(res, "DOWNLOAD cannot set debug function: ");

  // check to see if TLS verification is requested
  if (tls_verify) {
    res = ::curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 1);
    check_curl_result(res, "Unable to set TLS/SSL Verify on: ");
  } else {
    res = ::curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 0);
    check_curl_result(res, "Unable to set TLS/SSL Verify off: ");
  }
  // check to see if a CAINFO file has been specified
  // command arg comes first
  std::string const& cainfo_err = cmCurlSetCAInfo(curl, cainfo);
  if (!cainfo_err.empty()) {
    this->SetError(cainfo_err);
    return false;
  }

  cmFileCommandVectorOfChar chunkDebug;

  res = ::curl_easy_setopt(curl, CURLOPT_WRITEDATA, (void*)&fout);
  check_curl_result(res, "DOWNLOAD cannot set write data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_DEBUGDATA, (void*)&chunkDebug);
  check_curl_result(res, "DOWNLOAD cannot set debug data: ");

  res = ::curl_easy_setopt(curl, CURLOPT_FOLLOWLOCATION, 1L);
  check_curl_result(res, "DOWNLOAD cannot set follow-redirect option: ");

  if (!logVar.empty()) {
    res = ::curl_easy_setopt(curl, CURLOPT_VERBOSE, 1);
    check_curl_result(res, "DOWNLOAD cannot set verbose: ");
  }

  if (timeout > 0) {
    res = ::curl_easy_setopt(curl, CURLOPT_TIMEOUT, timeout);
    check_curl_result(res, "DOWNLOAD cannot set timeout: ");
  }

  if (inactivity_timeout > 0) {
    // Give up if there is no progress for a long time.
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_LIMIT, 1);
    ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_TIME, inactivity_timeout);
  }

  // Need the progress helper's scope to last through the duration of
  // the curl_easy_perform call... so this object is declared at function
  // scope intentionally, rather than inside the "if(showProgress)"
  // block...
  //
  cURLProgressHelper helper(this, "download");

  if (showProgress) {
    res = ::curl_easy_setopt(curl, CURLOPT_NOPROGRESS, 0);
    check_curl_result(res, "DOWNLOAD cannot set noprogress value: ");

    res = ::curl_easy_setopt(curl, CURLOPT_PROGRESSFUNCTION,
                             cmFileDownloadProgressCallback);
    check_curl_result(res, "DOWNLOAD cannot set progress function: ");

    res = ::curl_easy_setopt(curl, CURLOPT_PROGRESSDATA,
                             reinterpret_cast<void*>(&helper));
    check_curl_result(res, "DOWNLOAD cannot set progress data: ");
  }

  if (!userpwd.empty()) {
    res = ::curl_easy_setopt(curl, CURLOPT_USERPWD, userpwd.c_str());
    check_curl_result(res, "DOWNLOAD cannot set user password: ");
  }

  struct curl_slist* headers = CM_NULLPTR;
  for (std::vector<std::string>::const_iterator h = curl_headers.begin();
       h != curl_headers.end(); ++h) {
    headers = ::curl_slist_append(headers, h->c_str());
  }
  ::curl_easy_setopt(curl, CURLOPT_HTTPHEADER, headers);

  res = ::curl_easy_perform(curl);

  ::curl_slist_free_all(headers);

  /* always cleanup */
  g_curl.release();
  ::curl_easy_cleanup(curl);

  if (!statusVar.empty()) {
    std::ostringstream result;
    result << (int)res << ";\"" << ::curl_easy_strerror(res) << "\"";
    this->Makefile->AddDefinition(statusVar, result.str().c_str());
  }

  ::curl_global_cleanup();

  // Explicitly flush/close so we can measure the md5 accurately.
  //
  fout.flush();
  fout.close();

  // Verify MD5 sum if requested:
  //
  if (hash.get()) {
    std::string actualHash = hash->HashFile(file);
    if (actualHash.empty()) {
      this->SetError("DOWNLOAD cannot compute hash on downloaded file");
      return false;
    }

    if (expectedHash != actualHash) {
      std::ostringstream oss;
      oss << "DOWNLOAD HASH mismatch" << std::endl
          << "  for file: [" << file << "]" << std::endl
          << "    expected hash: [" << expectedHash << "]" << std::endl
          << "      actual hash: [" << actualHash << "]" << std::endl
          << "           status: [" << (int)res << ";\""
          << ::curl_easy_strerror(res) << "\"]" << std::endl;

      if (!statusVar.empty() && res == 0) {
        std::string status = "1;HASH mismatch: "
                             "expected: " +
          expectedHash + " actual: " + actualHash;
        this->Makefile->AddDefinition(statusVar, status.c_str());
      }

      this->SetError(oss.str());
      return false;
    }
  }

  if (!logVar.empty()) {
    chunkDebug.push_back(0);
    this->Makefile->AddDefinition(logVar, &*chunkDebug.begin());
  }

  return true;
#else
  this->SetError("DOWNLOAD not supported by bootstrap cmake.");
  return false;
#endif
}